

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,undefined4 param_2)

{
  StrWriter *this_local;
  Pcc pcc_local;
  
  switch(param_2) {
  case 0:
    operator<<(this,"bs");
    break;
  case 1:
    operator<<(this,"bc");
    break;
  case 2:
    operator<<(this,"ls");
    break;
  case 3:
    operator<<(this,"lc");
    break;
  case 4:
    operator<<(this,"ss");
    break;
  case 5:
    operator<<(this,"sc");
    break;
  case 6:
    operator<<(this,"as");
    break;
  case 7:
    operator<<(this,"ac");
    break;
  case 8:
    operator<<(this,"ws");
    break;
  case 9:
    operator<<(this,"wc");
    break;
  case 10:
    operator<<(this,"is");
    break;
  case 0xb:
    operator<<(this,"ic");
    break;
  case 0xc:
    operator<<(this,"gs");
    break;
  case 0xd:
    operator<<(this,"gc");
    break;
  case 0xe:
    operator<<(this,"cs");
    break;
  case 0xf:
    operator<<(this,"cc");
    break;
  default:
    operator<<(this,"?");
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Pcc pcc)
{
    switch (pcc.raw) {

        case 0:  *this << "bs"; break;
        case 1:  *this << "bc"; break;
        case 2:  *this << "ls"; break;
        case 3:  *this << "lc"; break;
        case 4:  *this << "ss"; break;
        case 5:  *this << "sc"; break;
        case 6:  *this << "as"; break;
        case 7:  *this << "ac"; break;
        case 8:  *this << "ws"; break;
        case 9:  *this << "wc"; break;
        case 10: *this << "is"; break;
        case 11: *this << "ic"; break;
        case 12: *this << "gs"; break;
        case 13: *this << "gc"; break;
        case 14: *this << "cs"; break;
        case 15: *this << "cc"; break;

        default:
            *this << "?";
    }
    return *this;
}